

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary.cpp
# Opt level: O0

bool __thiscall
CaDiCaL::Internal::hyper_ternary_resolve(Internal *this,Clause *c,int pivot,Clause *d)

{
  bool bVar1;
  Internal *pIVar2;
  Internal *pIVar3;
  literal_iterator piVar4;
  reference pvVar5;
  size_type sVar6;
  Internal *in_RCX;
  int in_EDX;
  Clause *in_RSI;
  long in_RDI;
  size_t size;
  int *lit_1;
  literal_iterator __end1_1;
  literal_iterator __begin1_1;
  Clause *__range1_1;
  int *lit;
  literal_iterator __end1;
  literal_iterator __begin1;
  Clause *__range1;
  undefined4 in_stack_ffffffffffffff78;
  int iVar7;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar8;
  undefined4 in_stack_ffffffffffffff80;
  int iVar9;
  undefined4 in_stack_ffffffffffffff84;
  int iVar10;
  int *local_58;
  Internal *in_stack_ffffffffffffffb8;
  Internal *pIVar11;
  bool local_1;
  
  *(long *)(in_RDI + 0x1378) = *(long *)(in_RDI + 0x1378) + 1;
  pIVar2 = (Internal *)Clause::begin(in_RSI);
  pIVar3 = (Internal *)Clause::end(in_RSI);
  while (pIVar2 != pIVar3) {
    pIVar11 = pIVar2;
    if (pIVar2->mode != in_EDX) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (value_type_conflict3 *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    in_stack_ffffffffffffffb8 = pIVar2;
    pIVar2 = (Internal *)&pIVar11->unsat;
  }
  pIVar3 = in_RCX;
  local_58 = Clause::begin((Clause *)in_RCX);
  piVar4 = Clause::end((Clause *)in_RCX);
  for (; iVar10 = (int)((ulong)pIVar2 >> 0x20), local_58 != piVar4; local_58 = local_58 + 1) {
    if (*local_58 != -in_EDX) {
      iVar10 = *local_58;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x440),0);
      if (iVar10 != *pvVar5) {
        iVar9 = *local_58;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x440),0);
        if (iVar9 == -*pvVar5) {
          return false;
        }
        iVar8 = *local_58;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x440),1);
        if (iVar8 != *pvVar5) {
          iVar7 = *local_58;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x440),1);
          if (iVar7 == -*pvVar5) {
            return false;
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar10,iVar9),
                     (value_type_conflict3 *)CONCAT44(iVar8,iVar7));
        }
      }
    }
  }
  sVar6 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x440));
  if (sVar6 < 4) {
    if (sVar6 == 2) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x440),0);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x440),1);
      bVar1 = ternary_find_binary_clause
                        (in_stack_ffffffffffffffb8,(int)((ulong)in_RCX >> 0x20),(int)in_RCX);
      if (bVar1) {
        return false;
      }
    }
    if (sVar6 == 3) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x440),0);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x440),1);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x440),2);
      bVar1 = ternary_find_ternary_clause(pIVar3,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,iVar10);
      if (bVar1) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Internal::hyper_ternary_resolve (Clause *c, int pivot, Clause *d) {
  LOG ("hyper binary resolving on pivot %d", pivot);
  LOG (c, "1st antecedent");
  LOG (d, "2nd antecedent");
  stats.ternres++;
  assert (c->size == 3);
  assert (d->size == 3);
  assert (clause.empty ());
  for (const auto &lit : *c)
    if (lit != pivot)
      clause.push_back (lit);
  for (const auto &lit : *d) {
    if (lit == -pivot)
      continue;
    if (lit == clause[0])
      continue;
    if (lit == -clause[0])
      return false;
    if (lit == clause[1])
      continue;
    if (lit == -clause[1])
      return false;
    clause.push_back (lit);
  }
  size_t size = clause.size ();
  if (size > 3)
    return false;
  if (size == 2 && ternary_find_binary_clause (clause[0], clause[1]))
    return false;
  if (size == 3 &&
      ternary_find_ternary_clause (clause[0], clause[1], clause[2]))
    return false;
  return true;
}